

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

void __thiscall
spvtools::val::ValidationState_t::RegisterStorageClassConsumer
          (ValidationState_t *this,StorageClass storage_class,Instruction *consumer)

{
  bool bVar1;
  iterator iVar2;
  _Node *p_Var3;
  code *pcVar4;
  char *in_RCX;
  uint *puVar5;
  _Any_data *p_Var6;
  long lVar7;
  string errorVUID;
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  long lStack_190;
  string local_188;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  bVar1 = spvIsVulkanEnv(this->context_->target_env);
  if (bVar1) {
    if ((int)storage_class < 0x14da) {
      if (0x14cf < (int)storage_class) goto LAB_001f1da4;
      if (storage_class == Output) {
        VkErrorID_abi_cxx11_(&local_188,this,0x1224,in_RCX);
        local_1a8 = (undefined1 *)CONCAT44(local_1a8._4_4_,consumer->function_->id_);
        iVar2 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->id_to_function_)._M_h,(key_type_conflict *)&local_1a8);
        if (iVar2.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
            ._M_cur == (__node_type *)0x0) {
          lVar7 = 0;
        }
        else {
          lVar7 = *(long *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
                                  ._M_cur + 0x10);
        }
        local_1a8 = &local_198;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,
                   CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p),
                   local_188._M_string_length +
                   CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p));
        local_88._8_8_ = 0;
        local_88._M_unused._M_object = operator_new(0x20);
        *(code **)local_88._M_unused._0_8_ = (code *)((long)local_88._M_unused._0_8_ + 0x10);
        if (local_1a8 == &local_198) {
          *(long *)((long)local_88._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
          *(long *)((long)local_88._M_unused._0_8_ + 0x18) = lStack_190;
        }
        else {
          *(undefined1 **)local_88._M_unused._0_8_ = local_1a8;
          *(long *)((long)local_88._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
        }
        *(long *)((long)local_88._M_unused._0_8_ + 8) = local_1a0;
        local_1a0 = 0;
        local_198 = 0;
        local_70 = std::
                   _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:635:46)>
                   ::_M_invoke;
        local_78 = std::
                   _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:635:46)>
                   ::_M_manager;
        local_1a8 = &local_198;
        p_Var3 = std::__cxx11::
                 list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                 ::
                 _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                           ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                             *)(lVar7 + 0x3b8),
                            (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                             *)&local_88);
        std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
        *(long *)(lVar7 + 0x3c8) = *(long *)(lVar7 + 0x3c8) + 1;
        if (local_78 != (code *)0x0) {
          p_Var6 = &local_88;
          pcVar4 = local_78;
          goto LAB_001f26ea;
        }
      }
      else {
        if (storage_class != StorageClassWorkgroup) {
          return;
        }
        VkErrorID_abi_cxx11_(&local_188,this,0x1225,in_RCX);
        local_1a8 = (undefined1 *)CONCAT44(local_1a8._4_4_,consumer->function_->id_);
        iVar2 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->id_to_function_)._M_h,(key_type_conflict *)&local_1a8);
        if (iVar2.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
            ._M_cur == (__node_type *)0x0) {
          lVar7 = 0;
        }
        else {
          lVar7 = *(long *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
                                  ._M_cur + 0x10);
        }
        local_1a8 = &local_198;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,
                   CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p),
                   local_188._M_string_length +
                   CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p));
        local_a8._8_8_ = 0;
        local_a8._M_unused._M_object = operator_new(0x20);
        *(code **)local_a8._M_unused._0_8_ = (code *)((long)local_a8._M_unused._0_8_ + 0x10);
        if (local_1a8 == &local_198) {
          *(long *)((long)local_a8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
          *(long *)((long)local_a8._M_unused._0_8_ + 0x18) = lStack_190;
        }
        else {
          *(undefined1 **)local_a8._M_unused._0_8_ = local_1a8;
          *(long *)((long)local_a8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
        }
        *(long *)((long)local_a8._M_unused._0_8_ + 8) = local_1a0;
        local_1a0 = 0;
        local_198 = 0;
        local_90 = std::
                   _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:662:46)>
                   ::_M_invoke;
        local_98 = std::
                   _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:662:46)>
                   ::_M_manager;
        local_1a8 = &local_198;
        p_Var3 = std::__cxx11::
                 list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                 ::
                 _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                           ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                             *)(lVar7 + 0x3b8),
                            (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                             *)&local_a8);
        std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
        *(long *)(lVar7 + 0x3c8) = *(long *)(lVar7 + 0x3c8) + 1;
        if (local_98 != (code *)0x0) {
          p_Var6 = &local_a8;
          pcVar4 = local_98;
          goto LAB_001f26ea;
        }
      }
    }
    else {
      puVar5 = &switchD_001f1c98::switchdataD_003cadf0;
      switch(storage_class) {
      case RayPayloadKHR:
        goto switchD_001f1c98_caseD_14da;
      case HitAttributeKHR:
switchD_001f1c98_caseD_14db:
        VkErrorID_abi_cxx11_(&local_188,this,0x125d,(char *)puVar5);
        local_1a8 = (undefined1 *)CONCAT44(local_1a8._4_4_,consumer->function_->id_);
        iVar2 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->id_to_function_)._M_h,(key_type_conflict *)&local_1a8);
        if (iVar2.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
            ._M_cur == (__node_type *)0x0) {
          lVar7 = 0;
        }
        else {
          lVar7 = *(long *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
                                  ._M_cur + 0x10);
        }
        local_1a8 = &local_198;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,
                   CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p),
                   local_188._M_string_length +
                   CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p));
        local_128._8_8_ = 0;
        local_128._M_unused._M_object = operator_new(0x20);
        *(code **)local_128._M_unused._0_8_ = (code *)((long)local_128._M_unused._0_8_ + 0x10);
        if (local_1a8 == &local_198) {
          *(long *)((long)local_128._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
          *(long *)((long)local_128._M_unused._0_8_ + 0x18) = lStack_190;
        }
        else {
          *(undefined1 **)local_128._M_unused._0_8_ = local_1a8;
          *(long *)((long)local_128._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
        }
        *(long *)((long)local_128._M_unused._0_8_ + 8) = local_1a0;
        local_1a0 = 0;
        local_198 = 0;
        local_110 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:742:13)>
                    ::_M_invoke;
        local_118 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:742:13)>
                    ::_M_manager;
        local_1a8 = &local_198;
        p_Var3 = std::__cxx11::
                 list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                 ::
                 _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                           ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                             *)(lVar7 + 0x3b8),
                            (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                             *)&local_128);
        std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
        *(long *)(lVar7 + 0x3c8) = *(long *)(lVar7 + 0x3c8) + 1;
        if (local_118 != (code *)0x0) {
          p_Var6 = &local_128;
          pcVar4 = local_118;
          goto LAB_001f26ea;
        }
        break;
      case CallableDataKHR|StorageBuffer:
      case CallableDataKHR|StorageBuffer|Input:
        goto switchD_001f1c98_caseD_14dc;
      case IncomingRayPayloadKHR:
switchD_001f1c98_caseD_14de:
        VkErrorID_abi_cxx11_(&local_188,this,0x125b,(char *)puVar5);
        local_1a8 = (undefined1 *)CONCAT44(local_1a8._4_4_,consumer->function_->id_);
        iVar2 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->id_to_function_)._M_h,(key_type_conflict *)&local_1a8);
        if (iVar2.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
            ._M_cur == (__node_type *)0x0) {
          lVar7 = 0;
        }
        else {
          lVar7 = *(long *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
                                  ._M_cur + 0x10);
        }
        local_1a8 = &local_198;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,
                   CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p),
                   local_188._M_string_length +
                   CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p));
        local_148._8_8_ = 0;
        local_148._M_unused._M_object = operator_new(0x20);
        *(code **)local_148._M_unused._0_8_ = (code *)((long)local_148._M_unused._0_8_ + 0x10);
        if (local_1a8 == &local_198) {
          *(long *)((long)local_148._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
          *(long *)((long)local_148._M_unused._0_8_ + 0x18) = lStack_190;
        }
        else {
          *(undefined1 **)local_148._M_unused._0_8_ = local_1a8;
          *(long *)((long)local_148._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
        }
        *(long *)((long)local_148._M_unused._0_8_ + 8) = local_1a0;
        local_1a0 = 0;
        local_198 = 0;
        local_130 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:760:13)>
                    ::_M_invoke;
        local_138 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:760:13)>
                    ::_M_manager;
        local_1a8 = &local_198;
        p_Var3 = std::__cxx11::
                 list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                 ::
                 _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                           ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                             *)(lVar7 + 0x3b8),
                            (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                             *)&local_148);
        std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
        *(long *)(lVar7 + 0x3c8) = *(long *)(lVar7 + 0x3c8) + 1;
        if (local_138 != (code *)0x0) {
          p_Var6 = &local_148;
          pcVar4 = local_138;
          goto LAB_001f26ea;
        }
        break;
      case ShaderRecordBufferKHR:
switchD_001f1c98_caseD_14df:
        VkErrorID_abi_cxx11_(&local_188,this,0x1bcf,(char *)puVar5);
        local_1a8 = (undefined1 *)CONCAT44(local_1a8._4_4_,consumer->function_->id_);
        iVar2 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->id_to_function_)._M_h,(key_type_conflict *)&local_1a8);
        if (iVar2.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
            ._M_cur == (__node_type *)0x0) {
          lVar7 = 0;
        }
        else {
          lVar7 = *(long *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
                                  ._M_cur + 0x10);
        }
        local_1a8 = &local_198;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,
                   CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p),
                   local_188._M_string_length +
                   CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p));
        local_168._8_8_ = 0;
        local_168._M_unused._M_object = operator_new(0x20);
        *(code **)local_168._M_unused._0_8_ = (code *)((long)local_168._M_unused._0_8_ + 0x10);
        if (local_1a8 == &local_198) {
          *(long *)((long)local_168._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
          *(long *)((long)local_168._M_unused._0_8_ + 0x18) = lStack_190;
        }
        else {
          *(undefined1 **)local_168._M_unused._0_8_ = local_1a8;
          *(long *)((long)local_168._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
        }
        *(long *)((long)local_168._M_unused._0_8_ + 8) = local_1a0;
        local_1a0 = 0;
        local_198 = 0;
        local_150 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:778:13)>
                    ::_M_invoke;
        local_158 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:778:13)>
                    ::_M_manager;
        local_1a8 = &local_198;
        p_Var3 = std::__cxx11::
                 list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                 ::
                 _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                           ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                             *)(lVar7 + 0x3b8),
                            (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                             *)&local_168);
        std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
        *(long *)(lVar7 + 0x3c8) = *(long *)(lVar7 + 0x3c8) + 1;
        if (local_158 != (code *)0x0) {
          p_Var6 = &local_168;
          pcVar4 = local_158;
          goto LAB_001f26ea;
        }
        break;
      default:
switchD_001f1c98_default:
        if (storage_class == HitObjectAttributeNV) {
          local_188._M_dataplus._M_p._0_4_ = consumer->function_->id_;
          iVar2 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->id_to_function_)._M_h,(key_type_conflict *)&local_188);
          if (iVar2.
              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
              ._M_cur == (__node_type *)0x0) {
            lVar7 = 0;
          }
          else {
            lVar7 = *(long *)((long)iVar2.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
                                    ._M_cur + 0x10);
          }
          local_68._M_unused._M_object = (void *)0x0;
          local_68._8_8_ = 0;
          local_50 = std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:813:44)>
                     ::_M_invoke;
          local_58 = std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:813:44)>
                     ::_M_manager;
          p_Var3 = std::__cxx11::
                   list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                   ::
                   _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                             ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                               *)(lVar7 + 0x3b8),
                              (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                               *)&local_68);
          std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
          *(long *)(lVar7 + 0x3c8) = *(long *)(lVar7 + 0x3c8) + 1;
          if (local_58 == (code *)0x0) {
            return;
          }
          p_Var6 = &local_68;
          pcVar4 = local_58;
        }
        else {
          if (storage_class != StorageClassTaskPayloadWorkgroupEXT) {
            return;
          }
          local_188._M_dataplus._M_p._0_4_ = consumer->function_->id_;
          iVar2 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->id_to_function_)._M_h,(key_type_conflict *)&local_188);
          if (iVar2.
              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
              ._M_cur == (__node_type *)0x0) {
            lVar7 = 0;
          }
          else {
            lVar7 = *(long *)((long)iVar2.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
                                    ._M_cur + 0x10);
          }
          local_48._M_unused._M_object = (void *)0x0;
          local_48._8_8_ = 0;
          local_30 = std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:799:13)>
                     ::_M_invoke;
          local_38 = std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:799:13)>
                     ::_M_manager;
          p_Var3 = std::__cxx11::
                   list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                   ::
                   _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                             ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                               *)(lVar7 + 0x3b8),
                              (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                               *)&local_48);
          std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
          *(long *)(lVar7 + 0x3c8) = *(long *)(lVar7 + 0x3c8) + 1;
          if (local_38 == (code *)0x0) {
            return;
          }
          p_Var6 = &local_48;
          pcVar4 = local_38;
        }
        (*pcVar4)(p_Var6,p_Var6,__destroy_functor);
        goto switchD_001f1c98_caseD_14dc;
      }
    }
  }
  else {
    if (0x14d9 < (int)storage_class) {
      puVar5 = &switchD_001f1cc1::switchdataD_003cadd8;
      switch(storage_class) {
      case RayPayloadKHR:
        goto switchD_001f1c98_caseD_14da;
      case HitAttributeKHR:
        goto switchD_001f1c98_caseD_14db;
      case CallableDataKHR|StorageBuffer:
      case CallableDataKHR|StorageBuffer|Input:
        goto switchD_001f1c98_caseD_14dc;
      case IncomingRayPayloadKHR:
        goto switchD_001f1c98_caseD_14de;
      case ShaderRecordBufferKHR:
        goto switchD_001f1c98_caseD_14df;
      default:
        goto switchD_001f1c98_default;
      }
    }
LAB_001f1da4:
    if (storage_class == CallableDataKHR) {
      VkErrorID_abi_cxx11_(&local_188,this,0x1260,in_RCX);
      local_1a8 = (undefined1 *)CONCAT44(local_1a8._4_4_,consumer->function_->id_);
      iVar2 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->id_to_function_)._M_h,(key_type_conflict *)&local_1a8);
      if (iVar2.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        lVar7 = 0;
      }
      else {
        lVar7 = *(long *)((long)iVar2.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
                                ._M_cur + 0x10);
      }
      local_1a8 = &local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,
                 CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p),
                 local_188._M_string_length +
                 CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p));
      local_c8._8_8_ = 0;
      local_c8._M_unused._M_object = operator_new(0x20);
      *(code **)local_c8._M_unused._0_8_ = (code *)((long)local_c8._M_unused._0_8_ + 0x10);
      if (local_1a8 == &local_198) {
        *(long *)((long)local_c8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
        *(long *)((long)local_c8._M_unused._0_8_ + 0x18) = lStack_190;
      }
      else {
        *(undefined1 **)local_c8._M_unused._0_8_ = local_1a8;
        *(long *)((long)local_c8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
      }
      *(long *)((long)local_c8._M_unused._0_8_ + 8) = local_1a0;
      local_1a0 = 0;
      local_198 = 0;
      local_b0 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:687:13)>
                 ::_M_invoke;
      local_b8 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:687:13)>
                 ::_M_manager;
      local_1a8 = &local_198;
      p_Var3 = std::__cxx11::
               list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
               ::
               _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                         ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                           *)(lVar7 + 0x3b8),
                          (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                           *)&local_c8);
      std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
      *(long *)(lVar7 + 0x3c8) = *(long *)(lVar7 + 0x3c8) + 1;
      if (local_b8 != (code *)0x0) {
        p_Var6 = &local_c8;
        pcVar4 = local_b8;
        goto LAB_001f26ea;
      }
    }
    else {
      if (storage_class != IncomingCallableDataKHR) {
        return;
      }
      VkErrorID_abi_cxx11_(&local_188,this,0x1261,in_RCX);
      local_1a8 = (undefined1 *)CONCAT44(local_1a8._4_4_,consumer->function_->id_);
      iVar2 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->id_to_function_)._M_h,(key_type_conflict *)&local_1a8);
      if (iVar2.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        lVar7 = 0;
      }
      else {
        lVar7 = *(long *)((long)iVar2.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
                                ._M_cur + 0x10);
      }
      local_1a8 = &local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,
                 CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p),
                 local_188._M_string_length +
                 CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p));
      local_e8._8_8_ = 0;
      local_e8._M_unused._M_object = operator_new(0x20);
      *(code **)local_e8._M_unused._0_8_ = (code *)((long)local_e8._M_unused._0_8_ + 0x10);
      if (local_1a8 == &local_198) {
        *(long *)((long)local_e8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
        *(long *)((long)local_e8._M_unused._0_8_ + 0x18) = lStack_190;
      }
      else {
        *(undefined1 **)local_e8._M_unused._0_8_ = local_1a8;
        *(long *)((long)local_e8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
      }
      *(long *)((long)local_e8._M_unused._0_8_ + 8) = local_1a0;
      local_1a0 = 0;
      local_198 = 0;
      local_d0 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:707:13)>
                 ::_M_invoke;
      local_d8 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:707:13)>
                 ::_M_manager;
      local_1a8 = &local_198;
      p_Var3 = std::__cxx11::
               list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
               ::
               _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                         ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                           *)(lVar7 + 0x3b8),
                          (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                           *)&local_e8);
      std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
      *(long *)(lVar7 + 0x3c8) = *(long *)(lVar7 + 0x3c8) + 1;
      if (local_d8 != (code *)0x0) {
        p_Var6 = &local_e8;
        pcVar4 = local_d8;
LAB_001f26ea:
        (*pcVar4)(p_Var6,p_Var6,__destroy_functor);
      }
    }
  }
LAB_001f26f4:
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p) !=
      &local_188.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p),
                    local_188.field_2._M_allocated_capacity + 1);
  }
switchD_001f1c98_caseD_14dc:
  return;
switchD_001f1c98_caseD_14da:
  VkErrorID_abi_cxx11_(&local_188,this,0x125a,(char *)puVar5);
  local_1a8 = (undefined1 *)CONCAT44(local_1a8._4_4_,consumer->function_->id_);
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->id_to_function_)._M_h,(key_type_conflict *)&local_1a8);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = *(long *)((long)iVar2.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Function_*>,_false>
                            ._M_cur + 0x10);
  }
  local_1a8 = &local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,
             CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p),
             local_188._M_string_length +
             CONCAT44(local_188._M_dataplus._M_p._4_4_,(uint32_t)local_188._M_dataplus._M_p));
  local_108._8_8_ = 0;
  local_108._M_unused._M_object = operator_new(0x20);
  *(code **)local_108._M_unused._0_8_ = (code *)((long)local_108._M_unused._0_8_ + 0x10);
  if (local_1a8 == &local_198) {
    *(long *)((long)local_108._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
    *(long *)((long)local_108._M_unused._0_8_ + 0x18) = lStack_190;
  }
  else {
    *(undefined1 **)local_108._M_unused._0_8_ = local_1a8;
    *(long *)((long)local_108._M_unused._0_8_ + 0x10) = CONCAT71(uStack_197,local_198);
  }
  *(long *)((long)local_108._M_unused._0_8_ + 8) = local_1a0;
  local_1a0 = 0;
  local_198 = 0;
  local_f0 = std::
             _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:722:44)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:722:44)>
             ::_M_manager;
  local_1a8 = &local_198;
  p_Var3 = std::__cxx11::
           list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
           ::_M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                     ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                       *)(lVar7 + 0x3b8),
                      (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                       *)&local_108);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  *(long *)(lVar7 + 0x3c8) = *(long *)(lVar7 + 0x3c8) + 1;
  if (local_f8 != (code *)0x0) {
    p_Var6 = &local_108;
    pcVar4 = local_f8;
    goto LAB_001f26ea;
  }
  goto LAB_001f26f4;
}

Assistant:

void ValidationState_t::RegisterStorageClassConsumer(
    spv::StorageClass storage_class, Instruction* consumer) {
  if (spvIsVulkanEnv(context()->target_env)) {
    if (storage_class == spv::StorageClass::Output) {
      std::string errorVUID = VkErrorID(4644);
      function(consumer->function()->id())
          ->RegisterExecutionModelLimitation([errorVUID](
                                                 spv::ExecutionModel model,
                                                 std::string* message) {
            if (model == spv::ExecutionModel::GLCompute ||
                model == spv::ExecutionModel::RayGenerationKHR ||
                model == spv::ExecutionModel::IntersectionKHR ||
                model == spv::ExecutionModel::AnyHitKHR ||
                model == spv::ExecutionModel::ClosestHitKHR ||
                model == spv::ExecutionModel::MissKHR ||
                model == spv::ExecutionModel::CallableKHR) {
              if (message) {
                *message =
                    errorVUID +
                    "in Vulkan environment, Output Storage Class must not be "
                    "used in GLCompute, RayGenerationKHR, IntersectionKHR, "
                    "AnyHitKHR, ClosestHitKHR, MissKHR, or CallableKHR "
                    "execution models";
              }
              return false;
            }
            return true;
          });
    }

    if (storage_class == spv::StorageClass::Workgroup) {
      std::string errorVUID = VkErrorID(4645);
      function(consumer->function()->id())
          ->RegisterExecutionModelLimitation([errorVUID](
                                                 spv::ExecutionModel model,
                                                 std::string* message) {
            if (model != spv::ExecutionModel::GLCompute &&
                model != spv::ExecutionModel::TaskNV &&
                model != spv::ExecutionModel::MeshNV &&
                model != spv::ExecutionModel::TaskEXT &&
                model != spv::ExecutionModel::MeshEXT) {
              if (message) {
                *message =
                    errorVUID +
                    "in Vulkan environment, Workgroup Storage Class is limited "
                    "to MeshNV, TaskNV, and GLCompute execution model";
              }
              return false;
            }
            return true;
          });
    }
  }

  if (storage_class == spv::StorageClass::CallableDataKHR) {
    std::string errorVUID = VkErrorID(4704);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::RayGenerationKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::CallableKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "CallableDataKHR Storage Class is limited to "
                      "RayGenerationKHR, ClosestHitKHR, CallableKHR, and "
                      "MissKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::IncomingCallableDataKHR) {
    std::string errorVUID = VkErrorID(4705);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::CallableKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "IncomingCallableDataKHR Storage Class is limited to "
                      "CallableKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::RayPayloadKHR) {
    std::string errorVUID = VkErrorID(4698);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation([errorVUID](
                                               spv::ExecutionModel model,
                                               std::string* message) {
          if (model != spv::ExecutionModel::RayGenerationKHR &&
              model != spv::ExecutionModel::ClosestHitKHR &&
              model != spv::ExecutionModel::MissKHR) {
            if (message) {
              *message =
                  errorVUID +
                  "RayPayloadKHR Storage Class is limited to RayGenerationKHR, "
                  "ClosestHitKHR, and MissKHR execution model";
            }
            return false;
          }
          return true;
        });
  } else if (storage_class == spv::StorageClass::HitAttributeKHR) {
    std::string errorVUID = VkErrorID(4701);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::IntersectionKHR &&
                  model != spv::ExecutionModel::AnyHitKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR) {
                if (message) {
                  *message = errorVUID +
                             "HitAttributeKHR Storage Class is limited to "
                             "IntersectionKHR, AnyHitKHR, sand ClosestHitKHR "
                             "execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::IncomingRayPayloadKHR) {
    std::string errorVUID = VkErrorID(4699);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::AnyHitKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "IncomingRayPayloadKHR Storage Class is limited to "
                      "AnyHitKHR, ClosestHitKHR, and MissKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::ShaderRecordBufferKHR) {
    std::string errorVUID = VkErrorID(7119);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::RayGenerationKHR &&
                  model != spv::ExecutionModel::IntersectionKHR &&
                  model != spv::ExecutionModel::AnyHitKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::CallableKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "ShaderRecordBufferKHR Storage Class is limited to "
                      "RayGenerationKHR, IntersectionKHR, AnyHitKHR, "
                      "ClosestHitKHR, CallableKHR, and MissKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::TaskPayloadWorkgroupEXT) {
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::TaskEXT &&
                  model != spv::ExecutionModel::MeshEXT) {
                if (message) {
                  *message =
                      "TaskPayloadWorkgroupEXT Storage Class is limited to "
                      "TaskEXT and MeshKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::HitObjectAttributeNV) {
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation([](spv::ExecutionModel model,
                                              std::string* message) {
          if (model != spv::ExecutionModel::RayGenerationKHR &&
              model != spv::ExecutionModel::ClosestHitKHR &&
              model != spv::ExecutionModel::MissKHR) {
            if (message) {
              *message =
                  "HitObjectAttributeNV Storage Class is limited to "
                  "RayGenerationKHR, ClosestHitKHR or MissKHR execution model";
            }
            return false;
          }
          return true;
        });
  }
}